

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void __thiscall QPainter::setPen(QPainter *this,QColor *color)

{
  long lVar1;
  QColor color_00;
  bool bVar2;
  QPainterPrivate *lhs;
  pointer pQVar3;
  QColor *in_RSI;
  QColor *in_RDI;
  long in_FS_OFFSET;
  QPainterPrivate *d;
  QColor actualColor;
  QColor *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = d_func((QPainter *)0x5984fa);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x598510);
  if (bVar2) {
    bVar2 = QColor::isValid(in_RSI);
    if (!bVar2) {
      QColor::QColor(in_RDI,(GlobalColor)((ulong)in_RSI >> 0x20));
    }
    std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
              ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x59859c);
    bVar2 = ::operator==((QPen *)lhs,in_stack_ffffffffffffff98);
    if (!bVar2) {
      std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x5985d7);
      color_00._8_8_ = in_stack_ffffffffffffffb8;
      color_00._0_8_ = in_RDI;
      QPen::operator=((QPen *)in_stack_ffffffffffffff98,color_00);
      if (lhs->extended == (QPaintEngineEx *)0x0) {
        pQVar3 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                           ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                            0x598621);
        QFlags<QPaintEngine::DirtyFlag>::operator|=
                  (&(pQVar3->super_QPaintEngineState).dirtyFlags,DirtyPen);
      }
      else {
        (*(lhs->extended->super_QPaintEngine)._vptr_QPaintEngine[0x21])();
      }
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)in_RSI,(int)((ulong)lhs >> 0x20),
               (char *)in_stack_ffffffffffffff98);
    QMessageLogger::warning(&stack0xffffffffffffffb8,"QPainter::setPen: Painter not active");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainter::setPen(const QColor &color)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::setPen(), color=%04x\n", color.rgb());
#endif
    Q_D(QPainter);
    if (!d->engine) {
        qWarning("QPainter::setPen: Painter not active");
        return;
    }

    const QColor actualColor = color.isValid() ? color : QColor(Qt::black);
    if (d->state->pen == actualColor)
        return;

    d->state->pen = actualColor;
    if (d->extended)
        d->extended->penChanged();
    else
        d->state->dirtyFlags |= QPaintEngine::DirtyPen;
}